

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O0

Vec_Int_t ** Ssw_TransformPairsIntoTempClasses(Vec_Int_t *vPairs,int nObjNumMax)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t **ppVVar5;
  void *__ptr;
  Vec_Int_t *pVVar6;
  int local_40;
  int i;
  int idReprRepr;
  int idReprObj;
  int idRepr;
  int idObj;
  int Entry;
  int *pReprs;
  Vec_Int_t **pvClasses;
  int nObjNumMax_local;
  Vec_Int_t *vPairs_local;
  
  ppVVar5 = (Vec_Int_t **)calloc((long)nObjNumMax,8);
  __ptr = malloc((long)nObjNumMax << 2);
  for (local_40 = 0; local_40 < nObjNumMax; local_40 = local_40 + 1) {
    *(undefined4 *)((long)__ptr + (long)local_40 * 4) = 0xffffffff;
  }
  local_40 = 0;
  while( true ) {
    iVar3 = Vec_IntSize(vPairs);
    if (iVar3 <= local_40) {
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      return ppVVar5;
    }
    iVar3 = Vec_IntEntry(vPairs,local_40);
    iVar4 = Vec_IntEntry(vPairs,local_40 + 1);
    if (iVar4 < 1) {
      __assert_fail("idObj > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswPairs.c"
                    ,0xa5,"Vec_Int_t **Ssw_TransformPairsIntoTempClasses(Vec_Int_t *, int)");
    }
    if ((*(int *)((long)__ptr + (long)iVar3 * 4) != -1) &&
       (ppVVar5[*(int *)((long)__ptr + (long)iVar3 * 4)] == (Vec_Int_t *)0x0)) {
      __assert_fail("(pReprs[idRepr] == -1) || (pvClasses[pReprs[idRepr]] != NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswPairs.c"
                    ,0xa6,"Vec_Int_t **Ssw_TransformPairsIntoTempClasses(Vec_Int_t *, int)");
    }
    if ((*(int *)((long)__ptr + (long)iVar4 * 4) != -1) &&
       (ppVVar5[*(int *)((long)__ptr + (long)iVar4 * 4)] == (Vec_Int_t *)0x0)) break;
    iVar1 = *(int *)((long)__ptr + (long)iVar3 * 4);
    iVar2 = *(int *)((long)__ptr + (long)iVar4 * 4);
    if ((iVar1 == -1) && (iVar2 == -1)) {
      pVVar6 = Vec_IntAlloc(4);
      ppVVar5[iVar3] = pVVar6;
      Vec_IntPush(ppVVar5[iVar3],iVar3);
      Vec_IntPush(ppVVar5[iVar3],iVar4);
      *(int *)((long)__ptr + (long)iVar3 * 4) = iVar3;
      *(int *)((long)__ptr + (long)iVar4 * 4) = iVar3;
    }
    else if ((iVar1 < 0) || (iVar2 != -1)) {
      if ((iVar1 == -1) && (-1 < iVar2)) {
        if (iVar2 == iVar3) {
          __assert_fail("idReprObj != idRepr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswPairs.c"
                        ,0xbd,"Vec_Int_t **Ssw_TransformPairsIntoTempClasses(Vec_Int_t *, int)");
        }
        if (iVar2 < iVar3) {
          Vec_IntPushUniqueOrder(ppVVar5[iVar2],iVar3);
          *(int *)((long)__ptr + (long)iVar3 * 4) = iVar2;
        }
        else {
          Vec_IntPushFirst(ppVVar5[iVar2],iVar3);
          ppVVar5[iVar3] = ppVVar5[iVar2];
          ppVVar5[iVar2] = (Vec_Int_t *)0x0;
          for (local_40 = 0; iVar4 = Vec_IntSize(ppVVar5[iVar3]), local_40 < iVar4;
              local_40 = local_40 + 1) {
            iVar4 = Vec_IntEntry(ppVVar5[iVar3],local_40);
            *(int *)((long)__ptr + (long)iVar4 * 4) = iVar3;
          }
        }
      }
      else if (iVar1 != iVar2) {
        if (iVar1 < iVar2) {
          for (local_40 = 0; iVar3 = Vec_IntSize(ppVVar5[iVar2]), local_40 < iVar3;
              local_40 = local_40 + 1) {
            iVar3 = Vec_IntEntry(ppVVar5[iVar2],local_40);
            Vec_IntPushUniqueOrder(ppVVar5[iVar1],iVar3);
            *(int *)((long)__ptr + (long)iVar3 * 4) = iVar1;
          }
          Vec_IntFree(ppVVar5[iVar2]);
          ppVVar5[iVar2] = (Vec_Int_t *)0x0;
        }
        else {
          for (local_40 = 0; iVar3 = Vec_IntSize(ppVVar5[iVar1]), local_40 < iVar3;
              local_40 = local_40 + 1) {
            iVar3 = Vec_IntEntry(ppVVar5[iVar1],local_40);
            Vec_IntPushUniqueOrder(ppVVar5[iVar2],iVar3);
            *(int *)((long)__ptr + (long)iVar3 * 4) = iVar2;
          }
          Vec_IntFree(ppVVar5[iVar1]);
          ppVVar5[iVar1] = (Vec_Int_t *)0x0;
        }
      }
    }
    else {
      Vec_IntPushUniqueOrder(ppVVar5[iVar1],iVar4);
      *(int *)((long)__ptr + (long)iVar4 * 4) = iVar1;
    }
    local_40 = local_40 + 2;
  }
  __assert_fail("(pReprs[idObj] == -1) || (pvClasses[pReprs[idObj] ] != NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswPairs.c"
                ,0xa7,"Vec_Int_t **Ssw_TransformPairsIntoTempClasses(Vec_Int_t *, int)");
}

Assistant:

Vec_Int_t ** Ssw_TransformPairsIntoTempClasses( Vec_Int_t * vPairs, int nObjNumMax )
{
    Vec_Int_t ** pvClasses;   // vector of classes
    int * pReprs;             // mapping nodes into their representatives
    int Entry, idObj, idRepr, idReprObj, idReprRepr, i;
    // allocate data-structures
    pvClasses = ABC_CALLOC( Vec_Int_t *, nObjNumMax );
    pReprs    = ABC_ALLOC( int, nObjNumMax );
    for ( i = 0; i < nObjNumMax; i++ )
        pReprs[i] = -1;
    // consider pairs
    for ( i = 0; i < Vec_IntSize(vPairs); i += 2 )
    {
        // get both objects
        idRepr = Vec_IntEntry( vPairs, i   );
        idObj  = Vec_IntEntry( vPairs, i+1 );
        assert( idObj > 0 );
        assert( (pReprs[idRepr] == -1) || (pvClasses[pReprs[idRepr]] != NULL) );
        assert( (pReprs[idObj]  == -1) || (pvClasses[pReprs[idObj] ] != NULL) );
        // get representatives of both objects
        idReprRepr = pReprs[idRepr];
        idReprObj  = pReprs[idObj];
        // check different situations
        if ( idReprRepr == -1 && idReprObj == -1 )
        {   // they do not have classes
            // create a class
            pvClasses[idRepr] = Vec_IntAlloc( 4 );
            Vec_IntPush( pvClasses[idRepr], idRepr );
            Vec_IntPush( pvClasses[idRepr], idObj );
            pReprs[ idRepr ] = idRepr;
            pReprs[ idObj  ] = idRepr;
        }
        else if ( idReprRepr >= 0 && idReprObj == -1 )
        {   // representative has a class
            // add iObj to the same class
            Vec_IntPushUniqueOrder( pvClasses[idReprRepr], idObj );
            pReprs[ idObj ] = idReprRepr;
        }
        else if ( idReprRepr == -1 && idReprObj >= 0 )
        {   // object has a class
            assert( idReprObj != idRepr );
            if ( idReprObj < idRepr )
            { // add idRepr to the same class
                Vec_IntPushUniqueOrder( pvClasses[idReprObj], idRepr );
                pReprs[ idRepr ] = idReprObj;
            }
            else // if ( idReprObj > idRepr )
            { // make idRepr new representative
                Vec_IntPushFirst( pvClasses[idReprObj], idRepr );
                pvClasses[idRepr] = pvClasses[idReprObj];
                pvClasses[idReprObj] = NULL;
                // set correct representatives of each node
                Vec_IntForEachEntry( pvClasses[idRepr], Entry, i )
                    pReprs[ Entry ] = idRepr;
            }
        }
        else // if ( idReprRepr >= 0 && idReprObj >= 0 )
        {   // both have classes
            if ( idReprRepr == idReprObj )
            {  // the classes are the same
                // nothing to do
            }
            else
            {  // the classes are different
                // find the repr of the new class
                if ( idReprRepr < idReprObj )
                {
                    Vec_IntForEachEntry( pvClasses[idReprObj], Entry, i )
                    {
                        Vec_IntPushUniqueOrder( pvClasses[idReprRepr], Entry );
                        pReprs[ Entry ] = idReprRepr;
                    }
                    Vec_IntFree( pvClasses[idReprObj] );
                    pvClasses[idReprObj] = NULL;
                }
                else // if ( idReprRepr > idReprObj )
                {
                    Vec_IntForEachEntry( pvClasses[idReprRepr], Entry, i )
                    {
                        Vec_IntPushUniqueOrder( pvClasses[idReprObj], Entry );
                        pReprs[ Entry ] = idReprObj;
                    }
                    Vec_IntFree( pvClasses[idReprRepr] );
                    pvClasses[idReprRepr] = NULL;
                }
            }
        }
    }
    ABC_FREE( pReprs );
    return pvClasses;
}